

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O3

int Abc_CommandAbc9GenSim(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Gia_Man_t *p;
  bool bVar1;
  bool bVar2;
  int iVar3;
  uint nWords0;
  uint uVar4;
  Vec_Wrd_t *pVVar5;
  char *pcVar6;
  uint fVerbose;
  int iVar7;
  char *pcVar8;
  uint local_48;
  
  bVar2 = false;
  Extra_UtilGetoptReset();
  local_48 = 0xffffffff;
  nWords0 = 4;
  bVar1 = false;
  fVerbose = 0;
LAB_0027aa25:
  do {
    while (iVar3 = Extra_UtilGetopt(argc,argv,"WRsdvh"), iVar7 = globalUtilOptind, iVar3 == 0x76) {
      fVerbose = fVerbose ^ 1;
    }
    if (iVar3 < 0x57) {
      if (iVar3 == -1) {
        p = pAbc->pGia;
        if (p != (Gia_Man_t *)0x0) {
          if (p->nRegs < 1) {
            if (bVar1) {
              if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
                Gia_ManPatSatImprove(p,nWords0,fVerbose);
                goto LAB_0027acf3;
              }
            }
            else if (bVar2) {
              if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
                Gia_ManPatDistImprove(p,fVerbose);
                goto LAB_0027acf3;
              }
            }
            else {
              if ((int)local_48 < 0) {
                Abc_Random(1);
                Vec_WrdFreeP(&pAbc->pGia->vSimsPi);
                pVVar5 = Vec_WrdStartRandom(pAbc->pGia->vCis->nSize * nWords0);
                pAbc->pGia->vSimsPi = pVVar5;
                printf("Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n"
                       ,(ulong)(nWords0 << 6),(ulong)nWords0);
LAB_0027acf3:
                Gia_ManSimProfile(pAbc->pGia);
                return 0;
              }
              if (p->vSimsPi != (Vec_Wrd_t *)0x0) {
                Gia_ManPatRareImprove(p,local_48,fVerbose);
                goto LAB_0027acf3;
              }
            }
            pcVar6 = "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n";
          }
          else {
            pcVar6 = "Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n";
          }
          Abc_Print(-1,pcVar6);
          return 0;
        }
        pcVar6 = "Abc_CommandAbc9GenSim(): There is no AIG.\n";
        iVar7 = -1;
        goto LAB_0027ac7d;
      }
      if (iVar3 != 0x52) goto LAB_0027abb8;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-R\" should be followed by an integer.\n";
LAB_0027abac:
        Abc_Print(-1,pcVar6);
        goto LAB_0027abb8;
      }
      local_48 = atoi(argv[globalUtilOptind]);
      uVar4 = local_48;
    }
    else {
      if (iVar3 == 0x73) {
        bVar1 = (bool)(bVar1 ^ 1);
        goto LAB_0027aa25;
      }
      if (iVar3 == 100) {
        bVar2 = (bool)(bVar2 ^ 1);
        goto LAB_0027aa25;
      }
      if (iVar3 != 0x57) goto LAB_0027abb8;
      if (argc <= globalUtilOptind) {
        pcVar6 = "Command line switch \"-W\" should be followed by an integer.\n";
        goto LAB_0027abac;
      }
      nWords0 = atoi(argv[globalUtilOptind]);
      uVar4 = nWords0;
    }
    globalUtilOptind = iVar7 + 1;
    if ((int)uVar4 < 0) {
LAB_0027abb8:
      Abc_Print(-2,"usage: &sim_gen [-WR num] [-sdvh]\n");
      Abc_Print(-2,"\t         generates random simulation patterns\n");
      Abc_Print(-2,"\t-W num : the number of 64-bit words of simulation info [default = %d]\n",
                (ulong)nWords0);
      Abc_Print(-2,"\t-R num : the rarity parameter used to define scope [default = %d]\n",
                (ulong)local_48);
      pcVar8 = "yes";
      pcVar6 = "yes";
      if (!bVar1) {
        pcVar6 = "no";
      }
      Abc_Print(-2,
                "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n"
                ,pcVar6);
      pcVar6 = "yes";
      if (!bVar2) {
        pcVar6 = "no";
      }
      Abc_Print(-2,"\t-d     : toggle using one improvement of available patterns [default = %s]\n",
                pcVar6);
      if (fVerbose == 0) {
        pcVar8 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar8);
      pcVar6 = "\t-h     : print the command usage\n";
      iVar7 = -2;
LAB_0027ac7d:
      Abc_Print(iVar7,pcVar6);
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9GenSim( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    extern void Gia_ManSimProfile( Gia_Man_t * pGia );
    extern void Gia_ManPatSatImprove( Gia_Man_t * pGia, int nWords, int fVerbose );
    extern void Gia_ManPatDistImprove( Gia_Man_t * p, int fVerbose );
    extern void Gia_ManPatRareImprove( Gia_Man_t * p, int RareLimit, int fVerbose );
    int c, nWords = 4, nRare = -1, fDist = 0, fSatBased = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "WRsdvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nWords = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nWords < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nRare = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRare < 0 )
                goto usage;
            break;
        case 's':
            fSatBased ^= 1;
            break;
        case 'd':
            fDist ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): There is no AIG.\n" );
        return 1;
    }
    if ( Gia_ManRegNum(pAbc->pGia) > 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9GenSim(): This command works only for combinational AIGs.\n" );
        return 0;
    }
    if ( fSatBased )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatSatImprove( pAbc->pGia, nWords, fVerbose );
    }
    else if ( fDist )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatDistImprove( pAbc->pGia, fVerbose );
    }
    else if ( nRare >= 0 )
    {
        if ( pAbc->pGia->vSimsPi == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9GenSim(): Does not have simulation information available.\n" );
            return 0;
        }
        Gia_ManPatRareImprove( pAbc->pGia, nRare, fVerbose );
    }
    else
    {
        Abc_Random(1);
        Vec_WrdFreeP( &pAbc->pGia->vSimsPi );
        pAbc->pGia->vSimsPi = Vec_WrdStartRandom( Gia_ManCiNum(pAbc->pGia) * nWords );
        printf( "Generated %d random patterns (%d 64-bit data words) for each input of the AIG.\n", 64*nWords, nWords );
    }
    Gia_ManSimProfile( pAbc->pGia );
    return 0;

usage:
    Abc_Print( -2, "usage: &sim_gen [-WR num] [-sdvh]\n" );
    Abc_Print( -2, "\t         generates random simulation patterns\n" );
    Abc_Print( -2, "\t-W num : the number of 64-bit words of simulation info [default = %d]\n",            nWords );
    Abc_Print( -2, "\t-R num : the rarity parameter used to define scope [default = %d]\n",                nRare );
    Abc_Print( -2, "\t-s     : toggle using SAT-based improvement of available patterns [default = %s]\n", fSatBased? "yes": "no" );
    Abc_Print( -2, "\t-d     : toggle using one improvement of available patterns [default = %s]\n",       fDist? "yes": "no" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",                      fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}